

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

char * flecs::_::component_info<Rocket>::name(world_t *world)

{
  char *pcVar1;
  world_t *world_local;
  
  if (s_id == 0) {
    id(world,(char *)0x0,true);
  }
  _ecs_assert(s_id != 0,0xc,(char *)0x0,"s_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe19);
  if (s_id != 0) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    return pcVar1;
  }
  __assert_fail("s_id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xe19,
                "static const char *flecs::_::component_info<Rocket>::name(world_t *) [T = Rocket]")
  ;
}

Assistant:

static const char* name(world_t *world = nullptr) {
        // If no id has been registered yet, do it now.
        if (!s_id) {
            id(world);
        }

        // By now we should have a valid identifier
        ecs_assert(s_id != 0, ECS_INTERNAL_ERROR, NULL);

        // If the id is set, the name should also have been set
        return s_name.c_str();
    }